

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

void __thiscall slang::driver::Driver::addParseOptions(Driver *this,Bag *bag)

{
  string_view endRegion;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  insert_type *x_00;
  pointer ppVar4;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *puVar5;
  pointer ppVar6;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *this_00;
  uint *puVar7;
  long in_RDI;
  ParserOptions poptions;
  type *end;
  type *start;
  type *common;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  *__range2_1;
  LexerOptions loptions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *d;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  PreprocessorOptions ppoptions;
  SourceOptions soptions;
  alloc_cted_insert_type<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  x;
  locator loc;
  size_t pos0;
  size_t hash;
  basic_string_view<char,_std::char_traits<char>_> *k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  locator loc_11;
  size_t pos0_11;
  size_t hash_11;
  basic_string_view<char,_std::char_traits<char>_> *k_11;
  locator loc_9;
  size_t pos0_9;
  size_t hash_9;
  basic_string_view<char,_std::char_traits<char>_> *k_9;
  locator loc_7;
  size_t pos0_7;
  size_t hash_7;
  basic_string_view<char,_std::char_traits<char>_> *k_7;
  locator loc_5;
  size_t pos0_5;
  size_t hash_5;
  basic_string_view<char,_std::char_traits<char>_> *k_5;
  locator loc_1;
  size_t pos0_1;
  size_t hash_1;
  basic_string_view<char,_std::char_traits<char>_> *k_1;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  uint n_5;
  value_type *p_5;
  value_type *elements_5;
  int mask_5;
  group_type *pg_5;
  size_t pos_5;
  prober pb_5;
  uint n_7;
  value_type *p_7;
  value_type *elements_7;
  int mask_7;
  group_type *pg_7;
  size_t pos_7;
  prober pb_7;
  uint n_9;
  value_type *p_9;
  value_type *elements_9;
  int mask_9;
  group_type *pg_9;
  size_t pos_9;
  prober pb_9;
  uint n_11;
  value_type *p_11;
  value_type *elements_11;
  int mask_11;
  group_type *pg_11;
  size_t pos_11;
  prober pb_11;
  locator loc_12;
  size_t pos0_12;
  size_t hash_12;
  basic_string_view<char,_std::char_traits<char>_> *k_12;
  locator loc_10;
  size_t pos0_10;
  size_t hash_10;
  basic_string_view<char,_std::char_traits<char>_> *k_10;
  locator loc_8;
  size_t pos0_8;
  size_t hash_8;
  basic_string_view<char,_std::char_traits<char>_> *k_8;
  locator loc_6;
  size_t pos0_6;
  size_t hash_6;
  basic_string_view<char,_std::char_traits<char>_> *k_6;
  locator loc_2;
  size_t pos0_2;
  size_t hash_2;
  basic_string_view<char,_std::char_traits<char>_> *k_2;
  uint n_2;
  value_type *p_2;
  value_type *elements_2;
  int mask_2;
  group_type *pg_2;
  size_t pos_2;
  prober pb_2;
  uint n_6;
  value_type *p_6;
  value_type *elements_6;
  int mask_6;
  group_type *pg_6;
  size_t pos_6;
  prober pb_6;
  uint n_8;
  value_type *p_8;
  value_type *elements_8;
  int mask_8;
  group_type *pg_8;
  size_t pos_8;
  prober pb_8;
  uint n_10;
  value_type *p_10;
  value_type *elements_10;
  int mask_10;
  group_type *pg_10;
  size_t pos_10;
  prober pb_10;
  uint n_12;
  value_type *p_12;
  value_type *elements_12;
  int mask_12;
  group_type *pg_12;
  size_t pos_12;
  prober pb_12;
  locator loc_3;
  size_t pos0_3;
  size_t hash_3;
  basic_string_view<char,_std::char_traits<char>_> *k_3;
  uint n_3;
  value_type *p_3;
  value_type *elements_3;
  int mask_3;
  group_type *pg_3;
  size_t pos_3;
  prober pb_3;
  locator loc_4;
  size_t pos0_4;
  size_t hash_4;
  basic_string_view<char,_std::char_traits<char>_> *k_4;
  uint n_4;
  value_type *p_4;
  value_type *elements_4;
  int mask_4;
  group_type *pg_4;
  size_t pos_4;
  prober pb_4;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffe658;
  undefined7 in_stack_ffffffffffffe660;
  undefined1 in_stack_ffffffffffffe667;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffe668;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffe670;
  raw_key_type *in_stack_ffffffffffffe678;
  undefined4 in_stack_ffffffffffffe680;
  undefined4 in_stack_ffffffffffffe684;
  size_t in_stack_ffffffffffffe688;
  PreprocessorOptions *item;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *in_stack_ffffffffffffe690;
  PreprocessorOptions *in_stack_ffffffffffffe6a0;
  PreprocessorOptions *pPVar8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffe6c0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffe6c8;
  table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_ffffffffffffe6d0;
  undefined4 in_stack_ffffffffffffe6d8;
  undefined4 in_stack_ffffffffffffe6dc;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *in_stack_ffffffffffffe6e0;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffe6f8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *ptVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffe700;
  ParserOptions local_1510;
  undefined1 local_1508 [16];
  undefined1 local_14f8 [16];
  string_view local_14e8;
  CommentHandler local_14d8;
  undefined1 local_14c0 [16];
  undefined1 local_14b0 [16];
  string_view local_14a0;
  CommentHandler local_1490;
  undefined1 local_1478 [16];
  undefined1 local_1468 [16];
  string_view local_1458;
  CommentHandler local_1448;
  undefined1 local_1430 [16];
  undefined1 local_1420 [16];
  string_view local_1410;
  CommentHandler local_1400;
  size_t local_13e8;
  char *pcStack_13e0;
  CommentHandler local_13d0;
  __tuple_element_t<2UL,_tuple<basic_string_view<char,_char_traits<char>_>,_basic_string_view<char,_char_traits<char>_>,_basic_string_view<char,_char_traits<char>_>_>_>
  *local_13b8;
  __tuple_element_t<1UL,_tuple<basic_string_view<char,_char_traits<char>_>,_basic_string_view<char,_char_traits<char>_>,_basic_string_view<char,_char_traits<char>_>_>_>
  *local_13b0;
  __tuple_element_t<0UL,_tuple<basic_string_view<char,_char_traits<char>_>,_basic_string_view<char,_char_traits<char>_>,_basic_string_view<char,_char_traits<char>_>_>_>
  *local_13a8;
  reference local_13a0;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_1398;
  __normal_iterator<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
  local_1390;
  long local_1388;
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  string_view local_1360;
  CommentHandler local_1350;
  undefined1 local_1331;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  local_1330;
  uint local_1300;
  undefined4 local_12fc;
  byte local_12f8;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
  local_12f0;
  reference local_12d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_12d0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_12c8;
  long local_12c0;
  uint local_12a8;
  undefined4 local_12a4;
  undefined1 local_1238 [8];
  size_t local_1230;
  ulong local_1218;
  ulong local_1210;
  undefined1 local_1202;
  undefined1 local_1201;
  undefined8 local_1200;
  undefined1 local_11f8;
  undefined1 local_11f7;
  undefined1 local_11f6;
  reference local_11e0;
  undefined1 *local_11d8;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_11d0;
  undefined1 *local_11b8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *local_11b0;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_11a8;
  undefined1 *local_1190;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *local_1188;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_1180;
  undefined1 *local_1168;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *local_1160;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_1158;
  undefined1 *local_1140;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *local_1138;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_1130;
  undefined1 *local_1118;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *local_1110;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_1108;
  undefined1 *local_10f0;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *local_10e8;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_10e0;
  undefined1 *local_10c8;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *local_10c0;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_10b8;
  undefined1 *local_10a0;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *local_1098;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_1090;
  undefined1 *local_1078;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *local_1070;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_1068;
  undefined1 *local_1050;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *local_1048;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_1040;
  __tuple_element_t<0UL,_tuple<basic_string_view<char,_char_traits<char>_>,_basic_string_view<char,_char_traits<char>_>,_basic_string_view<char,_char_traits<char>_>_>_>
  *local_1028;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *local_1020;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_1018;
  __tuple_element_t<1UL,_tuple<basic_string_view<char,_char_traits<char>_>,_basic_string_view<char,_char_traits<char>_>,_basic_string_view<char,_char_traits<char>_>_>_>
  *local_1000;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *local_ff8;
  reference local_fc8;
  undefined1 *local_fc0;
  bool local_fb1 [25];
  iterator local_f98;
  bool local_f81 [25];
  iterator local_f68;
  bool local_f51;
  iterator local_f50;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_f40;
  size_t local_f28;
  size_t local_f20;
  basic_string_view<char,_std::char_traits<char>_> *local_f18;
  element_type *local_f10;
  undefined1 *local_f08;
  uint local_efc;
  value_type *local_ef8;
  value_type *local_ef0;
  uint local_ee4;
  group_type *local_ee0;
  size_t local_ed8;
  pow2_quadratic_prober local_ed0;
  size_t local_ec0;
  size_t local_eb8;
  basic_string_view<char,_std::char_traits<char>_> *local_eb0;
  undefined1 *local_ea8;
  undefined1 local_e99;
  undefined1 *local_e98;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *local_e90;
  undefined1 local_e81;
  undefined1 *local_e80;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *local_e78;
  undefined1 local_e69;
  undefined1 *local_e68;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *local_e60;
  undefined1 local_e51;
  undefined1 *local_e50;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *local_e48;
  undefined1 local_e39;
  undefined1 *local_e38;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *local_e30;
  bool local_e21 [25];
  iterator local_e08;
  bool local_df1 [25];
  iterator local_dd8;
  bool local_dc1;
  iterator local_dc0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>
  local_db0;
  size_t local_d98;
  size_t local_d90;
  basic_string_view<char,_std::char_traits<char>_> *local_d88;
  undefined1 *local_d80;
  undefined1 *local_d78;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *local_d70;
  bool local_d61 [25];
  iterator local_d48;
  bool local_d31 [25];
  iterator local_d18;
  bool local_d01;
  iterator local_d00;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>
  local_cf0;
  size_t local_cd8;
  size_t local_cd0;
  basic_string_view<char,_std::char_traits<char>_> *local_cc8;
  undefined1 *local_cc0;
  undefined1 *local_cb8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *local_cb0;
  bool local_ca1 [25];
  iterator local_c88;
  bool local_c71 [25];
  iterator local_c58;
  bool local_c41;
  iterator local_c40;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>
  local_c30;
  size_t local_c18;
  size_t local_c10;
  basic_string_view<char,_std::char_traits<char>_> *local_c08;
  undefined1 *local_c00;
  undefined1 *local_bf8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *local_bf0;
  bool local_be1 [25];
  iterator local_bc8;
  bool local_bb1 [25];
  iterator local_b98;
  bool local_b81;
  iterator local_b80;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>
  local_b70;
  size_t local_b58;
  size_t local_b50;
  basic_string_view<char,_std::char_traits<char>_> *local_b48;
  undefined1 *local_b40;
  undefined1 *local_b38;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *local_b30;
  bool local_b21 [25];
  iterator local_b08;
  bool local_af1 [25];
  iterator local_ad8;
  bool local_ac1;
  iterator local_ac0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>
  local_ab0;
  size_t local_a98;
  size_t local_a90;
  basic_string_view<char,_std::char_traits<char>_> *local_a88;
  undefined1 *local_a80;
  undefined1 *local_a78;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *local_a70;
  uint local_a64;
  value_type *local_a60;
  value_type *local_a58;
  uint local_a4c;
  group_type *local_a48;
  size_t local_a40;
  pow2_quadratic_prober local_a38;
  size_t local_a28;
  size_t local_a20;
  basic_string_view<char,_std::char_traits<char>_> *local_a18;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *local_a10;
  uint local_a04;
  value_type *local_a00;
  value_type *local_9f8;
  uint local_9ec;
  group_type *local_9e8;
  size_t local_9e0;
  pow2_quadratic_prober local_9d8;
  size_t local_9c8;
  size_t local_9c0;
  basic_string_view<char,_std::char_traits<char>_> *local_9b8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *local_9b0;
  uint local_9a4;
  value_type *local_9a0;
  value_type *local_998;
  uint local_98c;
  group_type *local_988;
  size_t local_980;
  pow2_quadratic_prober local_978;
  size_t local_968;
  size_t local_960;
  basic_string_view<char,_std::char_traits<char>_> *local_958;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *local_950;
  uint local_944;
  value_type *local_940;
  value_type *local_938;
  uint local_92c;
  group_type *local_928;
  size_t local_920;
  pow2_quadratic_prober local_918;
  size_t local_908;
  size_t local_900;
  basic_string_view<char,_std::char_traits<char>_> *local_8f8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *local_8f0;
  uint local_8e4;
  value_type *local_8e0;
  value_type *local_8d8;
  uint local_8cc;
  group_type *local_8c8;
  size_t local_8c0;
  pow2_quadratic_prober local_8b8;
  size_t local_8a8;
  size_t local_8a0;
  basic_string_view<char,_std::char_traits<char>_> *local_898;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *local_890;
  undefined1 local_881;
  undefined1 *local_880;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *local_878;
  undefined1 local_869;
  undefined1 *local_868;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *local_860;
  undefined1 local_851;
  undefined1 *local_850;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *local_848;
  undefined1 local_839;
  undefined1 *local_838;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *local_830;
  undefined1 local_821;
  undefined1 *local_820;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *local_818;
  bool local_809 [25];
  iterator local_7f0;
  bool local_7d9 [25];
  iterator local_7c0;
  bool local_7a9;
  iterator local_7a8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>
  local_798;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *local_780;
  size_t local_778;
  basic_string_view<char,_std::char_traits<char>_> *local_770;
  undefined1 *local_768;
  undefined1 *local_760;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *local_758;
  bool local_749 [25];
  iterator local_730;
  bool local_719 [25];
  iterator local_700;
  bool local_6e9;
  iterator local_6e8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>
  local_6d8;
  size_t local_6c0;
  size_t local_6b8;
  basic_string_view<char,_std::char_traits<char>_> *local_6b0;
  undefined1 *local_6a8;
  undefined1 *local_6a0;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *local_698;
  bool local_689 [25];
  iterator local_670;
  bool local_659 [25];
  iterator local_640;
  bool local_629;
  iterator local_628;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>
  local_618;
  size_t local_600;
  size_t local_5f8;
  basic_string_view<char,_std::char_traits<char>_> *local_5f0;
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *local_5d8;
  bool local_5c9 [25];
  iterator local_5b0;
  bool local_599 [25];
  iterator local_580;
  bool local_569;
  iterator local_568;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>
  local_558;
  size_t local_540;
  size_t local_538;
  basic_string_view<char,_std::char_traits<char>_> *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *local_518;
  bool local_509 [25];
  iterator local_4f0;
  bool local_4d9 [25];
  iterator local_4c0;
  bool local_4a9;
  iterator local_4a8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>
  local_498;
  size_t local_480;
  size_t local_478;
  basic_string_view<char,_std::char_traits<char>_> *local_470;
  undefined1 *local_468;
  undefined1 *local_460;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *local_458;
  uint local_44c;
  value_type *local_448;
  value_type *local_440;
  uint local_434;
  group_type *local_430;
  size_t local_428;
  pow2_quadratic_prober local_420;
  size_t local_410;
  size_t local_408;
  basic_string_view<char,_std::char_traits<char>_> *local_400;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *local_3f8;
  uint local_3ec;
  value_type *local_3e8;
  value_type *local_3e0;
  uint local_3d4;
  group_type *local_3d0;
  size_t local_3c8;
  pow2_quadratic_prober local_3c0;
  size_t local_3b0;
  size_t local_3a8;
  basic_string_view<char,_std::char_traits<char>_> *local_3a0;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *local_398;
  uint local_38c;
  value_type *local_388;
  value_type *local_380;
  uint local_374;
  group_type *local_370;
  size_t local_368;
  pow2_quadratic_prober local_360;
  size_t local_350;
  size_t local_348;
  basic_string_view<char,_std::char_traits<char>_> *local_340;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *local_338;
  uint local_32c;
  value_type *local_328;
  value_type *local_320;
  uint local_314;
  group_type *local_310;
  size_t local_308;
  pow2_quadratic_prober local_300;
  size_t local_2f0;
  size_t local_2e8;
  basic_string_view<char,_std::char_traits<char>_> *local_2e0;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *local_2d8;
  uint local_2cc;
  value_type *local_2c8;
  value_type *local_2c0;
  uint local_2b4;
  group_type *local_2b0;
  size_t local_2a8;
  pow2_quadratic_prober local_2a0;
  size_t local_290;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *local_288;
  basic_string_view<char,_std::char_traits<char>_> *local_280;
  PreprocessorOptions *local_278;
  undefined1 local_269;
  __tuple_element_t<0UL,_tuple<basic_string_view<char,_char_traits<char>_>,_basic_string_view<char,_char_traits<char>_>,_basic_string_view<char,_char_traits<char>_>_>_>
  *local_268;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *local_260;
  bool local_251 [25];
  iterator local_238;
  bool local_221 [25];
  iterator local_208;
  bool local_1f1;
  iterator local_1f0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>
  local_1e0;
  size_t local_1c8;
  size_t local_1c0;
  basic_string_view<char,_std::char_traits<char>_> *local_1b8;
  __tuple_element_t<0UL,_tuple<basic_string_view<char,_char_traits<char>_>,_basic_string_view<char,_char_traits<char>_>,_basic_string_view<char,_char_traits<char>_>_>_>
  *local_1b0;
  undefined1 *local_1a8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *local_1a0;
  uint local_194;
  value_type *local_190;
  value_type *local_188;
  uint local_17c;
  group_type *local_178;
  size_t local_170;
  pow2_quadratic_prober local_168;
  size_t local_158;
  size_t local_150;
  basic_string_view<char,_std::char_traits<char>_> *local_148;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  *local_140;
  undefined1 local_131;
  __tuple_element_t<1UL,_tuple<basic_string_view<char,_char_traits<char>_>,_basic_string_view<char,_char_traits<char>_>,_basic_string_view<char,_char_traits<char>_>_>_>
  *local_130;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *local_128;
  bool local_119 [25];
  iterator local_100;
  bool local_e9 [25];
  iterator local_d0;
  bool local_b9;
  iterator local_b8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>
  local_a8;
  size_t local_90;
  size_t local_88;
  basic_string_view<char,_std::char_traits<char>_> *local_80;
  __tuple_element_t<1UL,_tuple<basic_string_view<char,_char_traits<char>_>,_basic_string_view<char,_char_traits<char>_>,_basic_string_view<char,_char_traits<char>_>_>_>
  *local_78;
  undefined1 *local_70;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  basic_string_view<char,_std::char_traits<char>_> *local_10;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *local_8;
  
  SourceOptions::SourceOptions((SourceOptions *)0x227554);
  local_1200 = *(undefined8 *)(in_RDI + 0x1258);
  local_1201 = 1;
  local_11f8 = std::operator==((optional<bool> *)
                               CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                               (bool *)in_stack_ffffffffffffe658);
  local_11f7 = Options::lintMode((Options *)
                                 CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
  local_1202 = 1;
  local_11f6 = std::operator==((optional<bool> *)
                               CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                               (bool *)in_stack_ffffffffffffe658);
  parsing::PreprocessorOptions::PreprocessorOptions(in_stack_ffffffffffffe6a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffe700,in_stack_ffffffffffffe6f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffe700,in_stack_ffffffffffffe6f8);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
             (char *)in_stack_ffffffffffffe658);
  local_12a4 = *(undefined4 *)(in_RDI + 0x11a8);
  bVar1 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x227662);
  if (bVar1) {
    puVar7 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x227680);
    local_12a8 = *puVar7;
  }
  local_12c0 = in_RDI + 0x1218;
  local_12c8._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffe658);
  local_12d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_ffffffffffffe658);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_ffffffffffffe658), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_12d8 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_12c8);
    local_11e0 = local_12d8;
    local_11d8 = local_1238;
    local_fc8 = local_12d8;
    local_fc0 = local_1238;
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::al((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *)0x227792);
    boost::unordered::detail::foa::
    alloc_cted_insert_type<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::alloc_cted_insert_type
              ((alloc_cted_insert_type<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
               (allocator<std::basic_string_view<char,_std::char_traits<char>_>_> *)
               in_stack_ffffffffffffe658,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2277aa);
    x_00 = boost::unordered::detail::foa::
           alloc_cted_insert_type<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           ::value((alloc_cted_insert_type<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    *)0x2277b9);
    local_f10 = boost::unordered::detail::foa::
                flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>::move(x_00);
    local_f08 = local_1238;
    local_f18 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                ::key_from<std::basic_string_view<char,std::char_traits<char>>>
                          ((basic_string_view<char,_std::char_traits<char>_> *)0x227817);
    local_f20 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                          ((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                           in_stack_ffffffffffffe658);
    local_f28 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                               (size_t)in_stack_ffffffffffffe658);
    local_eb0 = local_f18;
    local_ec0 = local_f20;
    local_eb8 = local_f28;
    local_ea8 = local_1238;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
              (&local_ed0,local_f28);
    do {
      local_ed8 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_ed0);
      local_ee0 = boost::unordered::detail::foa::
                  table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::groups((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            *)0x227916);
      local_ee0 = local_ee0 + local_ed8;
      local_ee4 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_ffffffffffffe668,
                             CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
      if (local_ee4 != 0) {
        local_ef0 = boost::unordered::detail::foa::
                    table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ::elements((table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                *)0x227974);
        local_ef8 = local_ef0 + local_ed8 * 0xf;
        do {
          local_efc = boost::unordered::detail::foa::unchecked_countr_zero(0);
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::pred((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)0x2279c7);
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          ::key_from<std::basic_string_view<char,std::char_traits<char>>>
                    ((basic_string_view<char,_std::char_traits<char>_> *)0x2279fa);
          bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                            ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                             CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
                             in_stack_ffffffffffffe678,in_stack_ffffffffffffe670);
          if (bVar1) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            ::table_locator(&local_f40,local_ee0,local_efc,local_ef8 + local_efc);
            goto LAB_00227b16;
          }
          local_ee4 = local_ee4 - 1 & local_ee4;
        } while (local_ee4 != 0);
      }
      bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                                  (size_t)in_stack_ffffffffffffe658);
      if (bVar1) {
        memset(&local_f40,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        ::table_locator(&local_f40);
        goto LAB_00227b16;
      }
      bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next(&local_ed0,local_1230);
    } while (bVar1);
    memset(&local_f40,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::basic_string_view<char,_std::char_traits<char>_>_>
    ::table_locator(&local_f40);
LAB_00227b16:
    bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                      ((table_locator *)&local_f40);
    if (bVar1) {
      local_f50 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::make_iterator((locator *)0x227b38);
      local_f51 = false;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                (&local_12f0,&local_f50,&local_f51);
    }
    else if (local_1210 < local_1218) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
                ((table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
                 (size_t)in_stack_ffffffffffffe678,(size_t)in_stack_ffffffffffffe670,
                 in_stack_ffffffffffffe668);
      local_f68 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::make_iterator((locator *)0x227bc0);
      local_f81[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                (&local_12f0,&local_f68,local_f81);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
                (in_stack_ffffffffffffe6d0,(size_t)in_stack_ffffffffffffe6c8,
                 in_stack_ffffffffffffe6c0);
      local_f98 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::make_iterator((locator *)0x227c2b);
      local_fb1[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                (&local_12f0,&local_f98,local_fb1);
    }
    boost::unordered::detail::foa::
    alloc_cted_insert_type<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~alloc_cted_insert_type
              ((alloc_cted_insert_type<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)0x227cb3);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_12c8);
  }
  parsing::LexerOptions::LexerOptions
            ((LexerOptions *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
  local_12fc = *(undefined4 *)(in_RDI + 0x11a8);
  local_1331 = 1;
  local_12f8 = std::operator==((optional<bool> *)
                               CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                               (bool *)in_stack_ffffffffffffe658);
  bVar1 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x227d3d);
  if (bVar1) {
    puVar7 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x227d5e);
    local_1300 = *puVar7;
  }
  if ((local_12f8 & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1360);
    parsing::CommentHandler::CommentHandler(&local_1350,Protect,local_1360);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffe670,(char *)in_stack_ffffffffffffe668);
    local_a78 = &local_e99;
    local_1118 = local_1370;
    local_1110 = &local_1330;
    local_e98 = local_1370;
    local_e90 = &local_1330;
    local_a80 = local_1370;
    local_a70 = &local_1330;
    local_a88 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                ::key_from<std::basic_string_view<char,std::char_traits<char>>>(local_1370);
    local_a90 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                          ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                            *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                           in_stack_ffffffffffffe658);
    local_a98 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                                *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                               (size_t)in_stack_ffffffffffffe658);
    local_a18 = local_a88;
    local_a28 = local_a90;
    local_a20 = local_a98;
    local_a10 = &local_1330;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
              (&local_a38,local_a98);
    do {
      local_a40 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_a38);
      local_a48 = boost::unordered::detail::foa::
                  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                  ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                            *)0x227f61);
      local_a48 = local_a48 + local_a40;
      local_a4c = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_ffffffffffffe668,
                             CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
      if (local_a4c != 0) {
        local_a58 = boost::unordered::detail::foa::
                    table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                    ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                                *)0x227fbf);
        local_a60 = local_a58 + local_a40 * 0xf;
        do {
          local_a64 = boost::unordered::detail::foa::unchecked_countr_zero(0);
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
          ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                  *)0x228012);
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
          ::
          key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>
                    ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                      *)0x228045);
          bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                            ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                             CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
                             in_stack_ffffffffffffe678,in_stack_ffffffffffffe670);
          if (bVar1) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>
            ::table_locator(&local_ab0,local_a48,local_a64,local_a60 + local_a64);
            goto LAB_00228161;
          }
          local_a4c = local_a4c - 1 & local_a4c;
        } while (local_a4c != 0);
      }
      bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                                  (size_t)in_stack_ffffffffffffe658);
      if (bVar1) {
        memset(&local_ab0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>
        ::table_locator(&local_ab0);
        goto LAB_00228161;
      }
      bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_a38,local_1330.arrays.groups_size_mask);
    } while (bVar1);
    memset(&local_ab0,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>
    ::table_locator(&local_ab0);
LAB_00228161:
    bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                      ((table_locator *)&local_ab0);
    if (bVar1) {
      local_ac0 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                  ::make_iterator((locator *)0x228183);
      local_ac1 = false;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_1130,&local_ac0,&local_ac1);
    }
    else if (local_1330.size_ctrl.size < local_1330.size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                (in_stack_ffffffffffffe690,in_stack_ffffffffffffe688,
                 CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
                 (try_emplace_args_t *)in_stack_ffffffffffffe678,in_stack_ffffffffffffe670);
      local_ad8 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                  ::make_iterator((locator *)0x228213);
      local_af1[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_1130,&local_ad8,local_af1);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                (in_stack_ffffffffffffe6e0,
                 CONCAT44(in_stack_ffffffffffffe6dc,in_stack_ffffffffffffe6d8),
                 (try_emplace_args_t *)in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6c8);
      local_b08 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                  ::make_iterator((locator *)0x228286);
      local_b21[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_1130,&local_b08,local_b21);
    }
    ppVar4 = boost::unordered::detail::foa::
             table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
             ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                           *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
    puVar5 = &ppVar4->second;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffe670,(char *)in_stack_ffffffffffffe668);
    local_460 = &local_881;
    local_1050 = local_1380;
    local_1048 = puVar5;
    local_880 = local_1380;
    local_878 = puVar5;
    local_468 = local_1380;
    local_458 = puVar5;
    local_470 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                ::key_from<std::basic_string_view<char,std::char_traits<char>>>(local_1380);
    local_478 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                          ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                            *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                           in_stack_ffffffffffffe658);
    local_480 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                                *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                               (size_t)in_stack_ffffffffffffe658);
    local_400 = local_470;
    local_410 = local_478;
    local_408 = local_480;
    local_3f8 = puVar5;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
              (&local_420,local_480);
    do {
      local_428 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_420);
      local_430 = boost::unordered::detail::foa::
                  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                  ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                            *)0x22846e);
      local_430 = local_430 + local_428;
      local_434 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_ffffffffffffe668,
                             CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
      if (local_434 != 0) {
        local_440 = boost::unordered::detail::foa::
                    table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                    ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                                *)0x2284cc);
        local_448 = local_440 + local_428 * 0xf;
        do {
          local_44c = boost::unordered::detail::foa::unchecked_countr_zero(0);
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
          ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                  *)0x22851f);
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
          ::
          key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>
                    ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>
                      *)0x228553);
          bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                            ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                             CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
                             in_stack_ffffffffffffe678,in_stack_ffffffffffffe670);
          if (bVar1) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>
            ::table_locator(&local_498,local_430,local_44c,local_448 + local_44c);
            goto LAB_0022866f;
          }
          local_434 = local_434 - 1 & local_434;
        } while (local_434 != 0);
      }
      bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                                  (size_t)in_stack_ffffffffffffe658);
      if (bVar1) {
        memset(&local_498,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>
        ::table_locator(&local_498);
        goto LAB_0022866f;
      }
      bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_420,
                         (ppVar4->second).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                         .arrays.groups_size_mask);
    } while (bVar1);
    memset(&local_498,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>
    ::table_locator(&local_498);
LAB_0022866f:
    bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                      ((table_locator *)&local_498);
    if (bVar1) {
      local_4a8 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                  ::make_iterator((locator *)0x228691);
      local_4a9 = false;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_1068,&local_4a8,&local_4a9);
    }
    else if ((ppVar4->second).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
             .size_ctrl.size <
             (ppVar4->second).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
             .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                  *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688,
                 CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
                 (try_emplace_args_t *)in_stack_ffffffffffffe678,in_stack_ffffffffffffe670);
      local_4c0 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                  ::make_iterator((locator *)0x228721);
      local_4d9[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_1068,&local_4c0,local_4d9);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                  *)in_stack_ffffffffffffe6e0,
                 CONCAT44(in_stack_ffffffffffffe6dc,in_stack_ffffffffffffe6d8),
                 (try_emplace_args_t *)in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6c8);
      local_4f0 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                  ::make_iterator((locator *)0x228794);
      local_509[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_1068,&local_4f0,local_509);
    }
    ppVar6 = boost::unordered::detail::foa::
             table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
             ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                           *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
    (ppVar6->second).kind = local_1350.kind;
    *(undefined4 *)&(ppVar6->second).field_0x4 = local_1350._4_4_;
    (ppVar6->second).endRegion._M_len = local_1350.endRegion._M_len;
    (ppVar6->second).endRegion._M_str = local_1350.endRegion._M_str;
  }
  local_1388 = in_RDI + 0x14b0;
  local_1390._M_current =
       (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
        *)std::
          vector<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          ::begin((vector<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                   *)in_stack_ffffffffffffe658);
  local_1398 = (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                *)std::
                  vector<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  ::end((vector<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                         *)in_stack_ffffffffffffe658);
  while (bVar1 = __gnu_cxx::
                 operator==<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                           ((__normal_iterator<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                             *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                            (__normal_iterator<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                             *)in_stack_ffffffffffffe658), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_13a0 = __gnu_cxx::
                 __normal_iterator<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
                 ::operator*(&local_1390);
    local_13a8 = std::
                 get<0ul,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                           ((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                             *)0x228893);
    local_13b0 = std::
                 get<1ul,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                           ((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                             *)0x2288a8);
    local_13b8 = std::
                 get<2ul,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
                           ((tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                             *)0x2288bd);
    local_13e8 = local_13b8->_M_len;
    pcStack_13e0 = local_13b8->_M_str;
    endRegion._M_len = local_13b8->_M_len;
    endRegion._M_str = local_13b8->_M_str;
    parsing::CommentHandler::CommentHandler(&local_13d0,TranslateOff,endRegion);
    local_1028 = local_13a8;
    local_268 = local_13a8;
    local_1a8 = &local_269;
    local_1b0 = local_13a8;
    local_1020 = &local_1330;
    local_260 = &local_1330;
    local_1a0 = &local_1330;
    local_1b8 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                ::key_from<std::basic_string_view<char,std::char_traits<char>>>(local_13a8);
    local_1c0 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                          ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                            *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                           in_stack_ffffffffffffe658);
    local_1c8 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                                *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                               (size_t)in_stack_ffffffffffffe658);
    local_148 = local_1b8;
    local_158 = local_1c0;
    local_150 = local_1c8;
    local_140 = &local_1330;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
              (&local_168,local_1c8);
    do {
      local_170 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_168);
      local_178 = boost::unordered::detail::foa::
                  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                  ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                            *)0x228a76);
      local_178 = local_178 + local_170;
      local_17c = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_ffffffffffffe668,
                             CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
      if (local_17c != 0) {
        local_188 = boost::unordered::detail::foa::
                    table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                    ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                                *)0x228ad4);
        local_190 = local_188 + local_170 * 0xf;
        do {
          local_194 = boost::unordered::detail::foa::unchecked_countr_zero(0);
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
          ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                  *)0x228b27);
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
          ::
          key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>
                    ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                      *)0x228b5a);
          bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                            ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                             CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
                             in_stack_ffffffffffffe678,in_stack_ffffffffffffe670);
          if (bVar1) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>
            ::table_locator(&local_1e0,local_178,local_194,local_190 + local_194);
            goto LAB_00228c76;
          }
          local_17c = local_17c - 1 & local_17c;
        } while (local_17c != 0);
      }
      bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                                  (size_t)in_stack_ffffffffffffe658);
      if (bVar1) {
        memset(&local_1e0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>
        ::table_locator(&local_1e0);
        goto LAB_00228c76;
      }
      bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_168,local_1330.arrays.groups_size_mask);
    } while (bVar1);
    memset(&local_1e0,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>
    ::table_locator(&local_1e0);
LAB_00228c76:
    bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                      ((table_locator *)&local_1e0);
    if (bVar1) {
      local_1f0 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                  ::make_iterator((locator *)0x228c96);
      local_1f1 = false;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_1040,&local_1f0,&local_1f1);
    }
    else if (local_1330.size_ctrl.size < local_1330.size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                (in_stack_ffffffffffffe690,in_stack_ffffffffffffe688,
                 CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
                 (try_emplace_args_t *)in_stack_ffffffffffffe678,in_stack_ffffffffffffe670);
      local_208 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                  ::make_iterator((locator *)0x228d26);
      local_221[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_1040,&local_208,local_221);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                (in_stack_ffffffffffffe6e0,
                 CONCAT44(in_stack_ffffffffffffe6dc,in_stack_ffffffffffffe6d8),
                 (try_emplace_args_t *)in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6c8);
      local_238 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                  ::make_iterator((locator *)0x228d99);
      local_251[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_1040,&local_238,local_251);
    }
    ppVar4 = boost::unordered::detail::foa::
             table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
             ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                           *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
    puVar5 = &ppVar4->second;
    local_1000 = local_13b0;
    local_130 = local_13b0;
    local_70 = &local_131;
    local_78 = local_13b0;
    local_ff8 = puVar5;
    local_128 = puVar5;
    local_68 = puVar5;
    local_80 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
               ::key_from<std::basic_string_view<char,std::char_traits<char>>>(local_13b0);
    local_88 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
               ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                         ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                           *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                          in_stack_ffffffffffffe658);
    local_90 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
               ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                               *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                              (size_t)in_stack_ffffffffffffe658);
    local_10 = local_80;
    local_20 = local_88;
    local_18 = local_90;
    local_8 = puVar5;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_90);
    do {
      local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
      local_40 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                 ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                           *)0x228f65);
      local_40 = local_40 + local_38;
      local_44 = boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match
                           ((group15<boost::unordered::detail::foa::plain_integral> *)
                            in_stack_ffffffffffffe668,
                            CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
      if (local_44 != 0) {
        local_50 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                   ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                               *)0x228fc3);
        local_58 = local_50 + local_38 * 0xf;
        do {
          local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
          ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                  *)0x229016);
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
          ::
          key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>
                    ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>
                      *)0x22904a);
          bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                            ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                             CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
                             in_stack_ffffffffffffe678,in_stack_ffffffffffffe670);
          if (bVar1) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>
            ::table_locator(&local_a8,local_40,local_5c,local_58 + local_5c);
            goto LAB_00229166;
          }
          local_44 = local_44 - 1 & local_44;
        } while (local_44 != 0);
      }
      bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                                  (size_t)in_stack_ffffffffffffe658);
      if (bVar1) {
        memset(&local_a8,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>
        ::table_locator(&local_a8);
        goto LAB_00229166;
      }
      bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_30,
                         (ppVar4->second).table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                         .arrays.groups_size_mask);
    } while (bVar1);
    memset(&local_a8,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>
    ::table_locator(&local_a8);
LAB_00229166:
    bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                      ((table_locator *)&local_a8);
    if (bVar1) {
      local_b8 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                 ::make_iterator((locator *)0x229186);
      local_b9 = false;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_1018,&local_b8,&local_b9);
    }
    else if ((ppVar4->second).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
             .size_ctrl.size <
             (ppVar4->second).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
             .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                  *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688,
                 CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
                 (try_emplace_args_t *)in_stack_ffffffffffffe678,in_stack_ffffffffffffe670);
      local_d0 = boost::unordered::detail::foa::
                 table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                 ::make_iterator((locator *)0x229216);
      local_e9[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_1018,&local_d0,local_e9);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                  *)in_stack_ffffffffffffe6e0,
                 CONCAT44(in_stack_ffffffffffffe6dc,in_stack_ffffffffffffe6d8),
                 (try_emplace_args_t *)in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6c8);
      local_100 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                  ::make_iterator((locator *)0x229289);
      local_119[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_1018,&local_100,local_119);
    }
    ppVar6 = boost::unordered::detail::foa::
             table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
             ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                           *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
    (ppVar6->second).kind = local_13d0.kind;
    *(undefined4 *)&(ppVar6->second).field_0x4 = local_13d0._4_4_;
    (ppVar6->second).endRegion._M_len = local_13d0.endRegion._M_len;
    (ppVar6->second).endRegion._M_str = local_13d0.endRegion._M_str;
    __gnu_cxx::
    __normal_iterator<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_*,_std::vector<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>
    ::operator++(&local_1390);
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1410);
  parsing::CommentHandler::CommentHandler(&local_1400,LintOff,local_1410);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffe670,(char *)in_stack_ffffffffffffe668);
  local_b38 = &local_e81;
  local_1140 = local_1420;
  local_1138 = &local_1330;
  local_e80 = local_1420;
  local_e78 = &local_1330;
  local_b40 = local_1420;
  local_b30 = &local_1330;
  local_b48 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
              ::key_from<std::basic_string_view<char,std::char_traits<char>>>(local_1420);
  local_b50 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
              ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                        ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                          *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                         in_stack_ffffffffffffe658);
  local_b58 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
              ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                              *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                             (size_t)in_stack_ffffffffffffe658);
  local_9b8 = local_b48;
  local_9c8 = local_b50;
  local_9c0 = local_b58;
  local_9b0 = &local_1330;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_9d8,local_b58);
  do {
    local_9e0 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_9d8);
    local_9e8 = boost::unordered::detail::foa::
                table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                          *)0x2294df);
    local_9e8 = local_9e8 + local_9e0;
    local_9ec = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_ffffffffffffe668,
                           CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
    if (local_9ec != 0) {
      local_9f8 = boost::unordered::detail::foa::
                  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                  ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                              *)0x22953d);
      local_a00 = local_9f8 + local_9e0 * 0xf;
      do {
        local_a04 = boost::unordered::detail::foa::unchecked_countr_zero(0);
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
        ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                *)0x229590);
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
        ::
        key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>
                  ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                    *)0x2295c3);
        bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
                           in_stack_ffffffffffffe678,in_stack_ffffffffffffe670);
        if (bVar1) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>
          ::table_locator(&local_b70,local_9e8,local_a04,local_a00 + local_a04);
          goto LAB_002296df;
        }
        local_9ec = local_9ec - 1 & local_9ec;
      } while (local_9ec != 0);
    }
    bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                              (size_t)in_stack_ffffffffffffe658);
    if (bVar1) {
      memset(&local_b70,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>
      ::table_locator(&local_b70);
      goto LAB_002296df;
    }
    bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_9d8,local_1330.arrays.groups_size_mask);
  } while (bVar1);
  memset(&local_b70,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>
  ::table_locator(&local_b70);
LAB_002296df:
  bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                    ((table_locator *)&local_b70);
  if (bVar1) {
    local_b80 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                ::make_iterator((locator *)0x229701);
    local_b81 = false;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_1158,&local_b80,&local_b81);
  }
  else if (local_1330.size_ctrl.size < local_1330.size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              (in_stack_ffffffffffffe690,in_stack_ffffffffffffe688,
               CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
               (try_emplace_args_t *)in_stack_ffffffffffffe678,in_stack_ffffffffffffe670);
    local_b98 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                ::make_iterator((locator *)0x229791);
    local_bb1[0] = true;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_1158,&local_b98,local_bb1);
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              (in_stack_ffffffffffffe6e0,
               CONCAT44(in_stack_ffffffffffffe6dc,in_stack_ffffffffffffe6d8),
               (try_emplace_args_t *)in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6c8);
    local_bc8 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                ::make_iterator((locator *)0x229804);
    local_be1[0] = true;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_1158,&local_bc8,local_be1);
  }
  ppVar4 = boost::unordered::detail::foa::
           table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
           ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                         *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
  puVar5 = &ppVar4->second;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffe670,(char *)in_stack_ffffffffffffe668);
  local_520 = &local_869;
  local_1078 = local_1430;
  local_1070 = puVar5;
  local_868 = local_1430;
  local_860 = puVar5;
  local_528 = local_1430;
  local_518 = puVar5;
  local_530 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
              ::key_from<std::basic_string_view<char,std::char_traits<char>>>(local_1430);
  local_538 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
              ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                        ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                          *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                         in_stack_ffffffffffffe658);
  local_540 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
              ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                              *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                             (size_t)in_stack_ffffffffffffe658);
  local_3a0 = local_530;
  local_3b0 = local_538;
  local_3a8 = local_540;
  local_398 = puVar5;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_3c0,local_540);
  do {
    local_3c8 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_3c0);
    local_3d0 = boost::unordered::detail::foa::
                table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                          *)0x2299ec);
    local_3d0 = local_3d0 + local_3c8;
    local_3d4 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_ffffffffffffe668,
                           CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
    if (local_3d4 != 0) {
      local_3e0 = boost::unordered::detail::foa::
                  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                  ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                              *)0x229a4a);
      local_3e8 = local_3e0 + local_3c8 * 0xf;
      do {
        local_3ec = boost::unordered::detail::foa::unchecked_countr_zero(0);
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
        ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                *)0x229a9d);
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
        ::
        key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>
                  ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>
                    *)0x229ad1);
        bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
                           in_stack_ffffffffffffe678,in_stack_ffffffffffffe670);
        if (bVar1) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>
          ::table_locator(&local_558,local_3d0,local_3ec,local_3e8 + local_3ec);
          goto LAB_00229bed;
        }
        local_3d4 = local_3d4 - 1 & local_3d4;
      } while (local_3d4 != 0);
    }
    bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                              (size_t)in_stack_ffffffffffffe658);
    if (bVar1) {
      memset(&local_558,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>
      ::table_locator(&local_558);
      goto LAB_00229bed;
    }
    bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_3c0,
                       (ppVar4->second).table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                       .arrays.groups_size_mask);
  } while (bVar1);
  memset(&local_558,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>
  ::table_locator(&local_558);
LAB_00229bed:
  bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                    ((table_locator *)&local_558);
  if (bVar1) {
    local_568 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                ::make_iterator((locator *)0x229c0f);
    local_569 = false;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_1090,&local_568,&local_569);
  }
  else if ((ppVar4->second).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
           .size_ctrl.size <
           (ppVar4->second).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
           .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688,
               CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
               (try_emplace_args_t *)in_stack_ffffffffffffe678,in_stack_ffffffffffffe670);
    local_580 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                ::make_iterator((locator *)0x229c9f);
    local_599[0] = true;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_1090,&local_580,local_599);
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                *)in_stack_ffffffffffffe6e0,
               CONCAT44(in_stack_ffffffffffffe6dc,in_stack_ffffffffffffe6d8),
               (try_emplace_args_t *)in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6c8);
    local_5b0 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                ::make_iterator((locator *)0x229d12);
    local_5c9[0] = true;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_1090,&local_5b0,local_5c9);
  }
  ppVar6 = boost::unordered::detail::foa::
           table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
           ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                         *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
  (ppVar6->second).endRegion._M_str = local_1400.endRegion._M_str;
  (ppVar6->second).kind = local_1400.kind;
  *(undefined4 *)&(ppVar6->second).field_0x4 = local_1400._4_4_;
  (ppVar6->second).endRegion._M_len = local_1400.endRegion._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1458);
  parsing::CommentHandler::CommentHandler(&local_1448,LintOn,local_1458);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffe670,(char *)in_stack_ffffffffffffe668);
  local_bf8 = &local_e69;
  local_1168 = local_1468;
  local_1160 = &local_1330;
  local_e68 = local_1468;
  local_e60 = &local_1330;
  local_c00 = local_1468;
  local_bf0 = &local_1330;
  local_c08 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
              ::key_from<std::basic_string_view<char,std::char_traits<char>>>(local_1468);
  local_c10 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
              ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                        ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                          *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                         in_stack_ffffffffffffe658);
  local_c18 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
              ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                              *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                             (size_t)in_stack_ffffffffffffe658);
  local_958 = local_c08;
  local_968 = local_c10;
  local_960 = local_c18;
  local_950 = &local_1330;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_978,local_c18);
  do {
    local_980 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_978);
    local_988 = boost::unordered::detail::foa::
                table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                          *)0x229f4a);
    local_988 = local_988 + local_980;
    local_98c = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_ffffffffffffe668,
                           CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
    if (local_98c != 0) {
      local_998 = boost::unordered::detail::foa::
                  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                  ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                              *)0x229fa8);
      local_9a0 = local_998 + local_980 * 0xf;
      do {
        local_9a4 = boost::unordered::detail::foa::unchecked_countr_zero(0);
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
        ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                *)0x229ffb);
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
        ::
        key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>
                  ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                    *)0x22a02e);
        bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
                           in_stack_ffffffffffffe678,in_stack_ffffffffffffe670);
        if (bVar1) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>
          ::table_locator(&local_c30,local_988,local_9a4,local_9a0 + local_9a4);
          goto LAB_0022a14a;
        }
        local_98c = local_98c - 1 & local_98c;
      } while (local_98c != 0);
    }
    bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                              (size_t)in_stack_ffffffffffffe658);
    if (bVar1) {
      memset(&local_c30,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>
      ::table_locator(&local_c30);
      goto LAB_0022a14a;
    }
    bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_978,local_1330.arrays.groups_size_mask);
  } while (bVar1);
  memset(&local_c30,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>
  ::table_locator(&local_c30);
LAB_0022a14a:
  bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                    ((table_locator *)&local_c30);
  if (bVar1) {
    local_c40 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                ::make_iterator((locator *)0x22a16c);
    local_c41 = false;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_1180,&local_c40,&local_c41);
  }
  else if (local_1330.size_ctrl.size < local_1330.size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              (in_stack_ffffffffffffe690,in_stack_ffffffffffffe688,
               CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
               (try_emplace_args_t *)in_stack_ffffffffffffe678,in_stack_ffffffffffffe670);
    local_c58 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                ::make_iterator((locator *)0x22a1fc);
    local_c71[0] = true;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_1180,&local_c58,local_c71);
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              (in_stack_ffffffffffffe6e0,
               CONCAT44(in_stack_ffffffffffffe6dc,in_stack_ffffffffffffe6d8),
               (try_emplace_args_t *)in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6c8);
    local_c88 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                ::make_iterator((locator *)0x22a26f);
    local_ca1[0] = true;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_1180,&local_c88,local_ca1);
  }
  ppVar4 = boost::unordered::detail::foa::
           table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
           ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                         *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
  puVar5 = &ppVar4->second;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffe670,(char *)in_stack_ffffffffffffe668);
  local_5e0 = &local_851;
  local_10a0 = local_1478;
  local_1098 = puVar5;
  local_850 = local_1478;
  local_848 = puVar5;
  local_5e8 = local_1478;
  local_5d8 = puVar5;
  local_5f0 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
              ::key_from<std::basic_string_view<char,std::char_traits<char>>>(local_1478);
  local_5f8 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
              ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                        ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                          *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                         in_stack_ffffffffffffe658);
  local_600 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
              ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                              *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                             (size_t)in_stack_ffffffffffffe658);
  local_340 = local_5f0;
  local_350 = local_5f8;
  local_348 = local_600;
  local_338 = puVar5;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_360,local_600);
  do {
    local_368 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_360);
    local_370 = boost::unordered::detail::foa::
                table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                          *)0x22a457);
    local_370 = local_370 + local_368;
    local_374 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_ffffffffffffe668,
                           CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
    if (local_374 != 0) {
      local_380 = boost::unordered::detail::foa::
                  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                  ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                              *)0x22a4b5);
      local_388 = local_380 + local_368 * 0xf;
      do {
        local_38c = boost::unordered::detail::foa::unchecked_countr_zero(0);
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
        ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                *)0x22a508);
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
        ::
        key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>
                  ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>
                    *)0x22a53c);
        bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
                           in_stack_ffffffffffffe678,in_stack_ffffffffffffe670);
        if (bVar1) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>
          ::table_locator(&local_618,local_370,local_38c,local_388 + local_38c);
          goto LAB_0022a658;
        }
        local_374 = local_374 - 1 & local_374;
      } while (local_374 != 0);
    }
    bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                              (size_t)in_stack_ffffffffffffe658);
    if (bVar1) {
      memset(&local_618,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>
      ::table_locator(&local_618);
      goto LAB_0022a658;
    }
    bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_360,
                       (ppVar4->second).table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                       .arrays.groups_size_mask);
  } while (bVar1);
  memset(&local_618,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>
  ::table_locator(&local_618);
LAB_0022a658:
  bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                    ((table_locator *)&local_618);
  if (bVar1) {
    local_628 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                ::make_iterator((locator *)0x22a67a);
    local_629 = false;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_10b8,&local_628,&local_629);
  }
  else if ((ppVar4->second).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
           .size_ctrl.size <
           (ppVar4->second).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
           .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688,
               CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
               (try_emplace_args_t *)in_stack_ffffffffffffe678,in_stack_ffffffffffffe670);
    local_640 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                ::make_iterator((locator *)0x22a70a);
    local_659[0] = true;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_10b8,&local_640,local_659);
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                *)in_stack_ffffffffffffe6e0,
               CONCAT44(in_stack_ffffffffffffe6dc,in_stack_ffffffffffffe6d8),
               (try_emplace_args_t *)in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6c8);
    local_670 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                ::make_iterator((locator *)0x22a77d);
    local_689[0] = true;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_10b8,&local_670,local_689);
  }
  ppVar6 = boost::unordered::detail::foa::
           table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
           ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                         *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
  (ppVar6->second).endRegion._M_str = local_1448.endRegion._M_str;
  (ppVar6->second).kind = local_1448.kind;
  *(undefined4 *)&(ppVar6->second).field_0x4 = local_1448._4_4_;
  (ppVar6->second).endRegion._M_len = local_1448.endRegion._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_14a0);
  parsing::CommentHandler::CommentHandler(&local_1490,LintSave,local_14a0);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffe670,(char *)in_stack_ffffffffffffe668);
  local_cb8 = &local_e51;
  local_1190 = local_14b0;
  local_1188 = &local_1330;
  local_e50 = local_14b0;
  local_e48 = &local_1330;
  local_cc0 = local_14b0;
  local_cb0 = &local_1330;
  local_cc8 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
              ::key_from<std::basic_string_view<char,std::char_traits<char>>>(local_14b0);
  local_cd0 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
              ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                        ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                          *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                         in_stack_ffffffffffffe658);
  local_cd8 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
              ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                              *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                             (size_t)in_stack_ffffffffffffe658);
  local_8f8 = local_cc8;
  local_908 = local_cd0;
  local_900 = local_cd8;
  local_8f0 = &local_1330;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_918,local_cd8);
  do {
    local_920 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_918);
    local_928 = boost::unordered::detail::foa::
                table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                          *)0x22a9b5);
    local_928 = local_928 + local_920;
    local_92c = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_ffffffffffffe668,
                           CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
    if (local_92c != 0) {
      local_938 = boost::unordered::detail::foa::
                  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                  ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                              *)0x22aa13);
      local_940 = local_938 + local_920 * 0xf;
      do {
        local_944 = boost::unordered::detail::foa::unchecked_countr_zero(0);
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
        ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                *)0x22aa66);
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
        ::
        key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>
                  ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                    *)0x22aa99);
        bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
                           in_stack_ffffffffffffe678,in_stack_ffffffffffffe670);
        if (bVar1) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>
          ::table_locator(&local_cf0,local_928,local_944,local_940 + local_944);
          goto LAB_0022abb5;
        }
        local_92c = local_92c - 1 & local_92c;
      } while (local_92c != 0);
    }
    bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                              (size_t)in_stack_ffffffffffffe658);
    if (bVar1) {
      memset(&local_cf0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>
      ::table_locator(&local_cf0);
      goto LAB_0022abb5;
    }
    bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_918,local_1330.arrays.groups_size_mask);
  } while (bVar1);
  memset(&local_cf0,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>
  ::table_locator(&local_cf0);
LAB_0022abb5:
  bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                    ((table_locator *)&local_cf0);
  if (bVar1) {
    local_d00 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                ::make_iterator((locator *)0x22abd7);
    local_d01 = false;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_11a8,&local_d00,&local_d01);
  }
  else if (local_1330.size_ctrl.size < local_1330.size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              (in_stack_ffffffffffffe690,in_stack_ffffffffffffe688,
               CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
               (try_emplace_args_t *)in_stack_ffffffffffffe678,in_stack_ffffffffffffe670);
    local_d18 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                ::make_iterator((locator *)0x22ac67);
    local_d31[0] = true;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_11a8,&local_d18,local_d31);
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              (in_stack_ffffffffffffe6e0,
               CONCAT44(in_stack_ffffffffffffe6dc,in_stack_ffffffffffffe6d8),
               (try_emplace_args_t *)in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6c8);
    local_d48 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                ::make_iterator((locator *)0x22acda);
    local_d61[0] = true;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_11a8,&local_d48,local_d61);
  }
  ppVar4 = boost::unordered::detail::foa::
           table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
           ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                         *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
  puVar5 = &ppVar4->second;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffe670,(char *)in_stack_ffffffffffffe668);
  local_6a0 = &local_839;
  local_10c8 = local_14c0;
  local_10c0 = puVar5;
  local_838 = local_14c0;
  local_830 = puVar5;
  local_6a8 = local_14c0;
  local_698 = puVar5;
  local_6b0 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
              ::key_from<std::basic_string_view<char,std::char_traits<char>>>(local_14c0);
  local_6b8 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
              ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                        ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                          *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                         in_stack_ffffffffffffe658);
  local_6c0 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
              ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                              *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                             (size_t)in_stack_ffffffffffffe658);
  local_2e0 = local_6b0;
  local_2f0 = local_6b8;
  local_2e8 = local_6c0;
  local_2d8 = puVar5;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_300,local_6c0);
  do {
    local_308 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_300);
    local_310 = boost::unordered::detail::foa::
                table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                          *)0x22aec2);
    local_310 = local_310 + local_308;
    local_314 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_ffffffffffffe668,
                           CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
    if (local_314 != 0) {
      local_320 = boost::unordered::detail::foa::
                  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                  ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                              *)0x22af20);
      local_328 = local_320 + local_308 * 0xf;
      do {
        local_32c = boost::unordered::detail::foa::unchecked_countr_zero(0);
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
        ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                *)0x22af73);
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
        ::
        key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>
                  ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>
                    *)0x22afa7);
        bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
                           in_stack_ffffffffffffe678,in_stack_ffffffffffffe670);
        if (bVar1) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>
          ::table_locator(&local_6d8,local_310,local_32c,local_328 + local_32c);
          goto LAB_0022b0c3;
        }
        local_314 = local_314 - 1 & local_314;
      } while (local_314 != 0);
    }
    bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                              (size_t)in_stack_ffffffffffffe658);
    if (bVar1) {
      memset(&local_6d8,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>
      ::table_locator(&local_6d8);
      goto LAB_0022b0c3;
    }
    bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_300,
                       (ppVar4->second).table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                       .arrays.groups_size_mask);
  } while (bVar1);
  memset(&local_6d8,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>
  ::table_locator(&local_6d8);
LAB_0022b0c3:
  bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                    ((table_locator *)&local_6d8);
  if (bVar1) {
    local_6e8 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                ::make_iterator((locator *)0x22b0e5);
    local_6e9 = false;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_10e0,&local_6e8,&local_6e9);
  }
  else if ((ppVar4->second).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
           .size_ctrl.size <
           (ppVar4->second).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
           .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                *)in_stack_ffffffffffffe690,in_stack_ffffffffffffe688,
               CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
               (try_emplace_args_t *)in_stack_ffffffffffffe678,in_stack_ffffffffffffe670);
    local_700 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                ::make_iterator((locator *)0x22b175);
    local_719[0] = true;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_10e0,&local_700,local_719);
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                *)in_stack_ffffffffffffe6e0,
               CONCAT44(in_stack_ffffffffffffe6dc,in_stack_ffffffffffffe6d8),
               (try_emplace_args_t *)in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6c8);
    local_730 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                ::make_iterator((locator *)0x22b1e8);
    local_749[0] = true;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_10e0,&local_730,local_749);
  }
  ppVar6 = boost::unordered::detail::foa::
           table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
           ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                         *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
  (ppVar6->second).endRegion._M_str = local_1490.endRegion._M_str;
  (ppVar6->second).kind = local_1490.kind;
  *(undefined4 *)&(ppVar6->second).field_0x4 = local_1490._4_4_;
  (ppVar6->second).endRegion._M_len = local_1490.endRegion._M_len;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_14e8);
  parsing::CommentHandler::CommentHandler(&local_14d8,LintRestore,local_14e8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffe670,(char *)in_stack_ffffffffffffe668);
  this_01 = &local_1330;
  local_d78 = &local_e39;
  local_11b8 = local_14f8;
  local_11b0 = this_01;
  local_e38 = local_14f8;
  local_e30 = this_01;
  local_d80 = local_14f8;
  local_d70 = this_01;
  local_d88 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
              ::key_from<std::basic_string_view<char,std::char_traits<char>>>(local_14f8);
  local_d90 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
              ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                        ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                          *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                         in_stack_ffffffffffffe658);
  local_d98 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
              ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                              *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                             (size_t)in_stack_ffffffffffffe658);
  local_898 = local_d88;
  local_8a8 = local_d90;
  ptVar9 = this_01;
  local_8a0 = local_d98;
  local_890 = this_01;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_8b8,local_d98);
  do {
    local_8c0 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_8b8);
    local_8c8 = boost::unordered::detail::foa::
                table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                          *)0x22b420);
    local_8c8 = local_8c8 + local_8c0;
    uVar2 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match((group15<boost::unordered::detail::foa::plain_integral> *)
                  in_stack_ffffffffffffe668,
                  CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
    local_8cc = uVar2;
    if (uVar2 != 0) {
      local_8d8 = boost::unordered::detail::foa::
                  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                  ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                              *)0x22b47e);
      local_8e0 = local_8d8 + local_8c0 * 0xf;
      do {
        local_8e4 = boost::unordered::detail::foa::unchecked_countr_zero(0);
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
        ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                *)0x22b4d1);
        in_stack_ffffffffffffe6c8 = local_898;
        in_stack_ffffffffffffe6d0 =
             (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                ::
                key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>
                          ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                            *)0x22b4fe);
        bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
                           in_stack_ffffffffffffe678,in_stack_ffffffffffffe670);
        if (bVar1) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>
          ::table_locator(&local_db0,local_8c8,local_8e4,local_8e0 + local_8e4);
          goto LAB_0022b608;
        }
        local_8cc = local_8cc - 1 & local_8cc;
      } while (local_8cc != 0);
    }
    bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                              CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                              (size_t)in_stack_ffffffffffffe658);
    if (bVar1) {
      memset(&local_db0,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>
      ::table_locator(&local_db0);
      goto LAB_0022b608;
    }
    bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_8b8,(this_01->arrays).groups_size_mask);
  } while (bVar1);
  memset(&local_db0,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>
  ::table_locator(&local_db0);
LAB_0022b608:
  bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                    ((table_locator *)&local_db0);
  if (bVar1) {
    local_dc0 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                ::make_iterator((locator *)0x22b62a);
    local_dc1 = false;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_11d0,&local_dc0,&local_dc1);
  }
  else if ((ptVar9->size_ctrl).size < (ptVar9->size_ctrl).ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              (in_stack_ffffffffffffe690,in_stack_ffffffffffffe688,
               CONCAT44(in_stack_ffffffffffffe684,in_stack_ffffffffffffe680),
               (try_emplace_args_t *)in_stack_ffffffffffffe678,in_stack_ffffffffffffe670);
    local_dd8 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                ::make_iterator((locator *)0x22b6ba);
    local_df1[0] = true;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_11d0,&local_dd8,local_df1);
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              (this_01,CONCAT44(uVar2,in_stack_ffffffffffffe6d8),
               (try_emplace_args_t *)in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6c8);
    local_e08 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                ::make_iterator((locator *)0x22b72d);
    local_e21[0] = true;
    std::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
    ::
    pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
              (&local_11d0,&local_e08,local_e21);
  }
  ppVar4 = boost::unordered::detail::foa::
           table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
           ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                         *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
  item = (PreprocessorOptions *)&ppVar4->second;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffe670,(char *)in_stack_ffffffffffffe668);
  local_760 = &local_821;
  local_10f0 = local_1508;
  local_10e8 = (unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                *)item;
  local_820 = local_1508;
  local_818 = (unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
               *)item;
  local_768 = local_1508;
  local_758 = (unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
               *)item;
  local_770 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
              ::key_from<std::basic_string_view<char,std::char_traits<char>>>(local_1508);
  local_778 = boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
              ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                        ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                          *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                         in_stack_ffffffffffffe658);
  this_00 = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
             *)boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
               ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                               *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                              (size_t)in_stack_ffffffffffffe658);
  local_280 = local_770;
  local_290 = local_778;
  pPVar8 = item;
  local_780 = this_00;
  local_288 = this_00;
  local_278 = item;
  boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
            (&local_2a0,(size_t)this_00);
  while( true ) {
    local_2a8 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_2a0);
    local_2b0 = boost::unordered::detail::foa::
                table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                          *)0x22b8eb);
    local_2b0 = local_2b0 + local_2a8;
    uVar3 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match((group15<boost::unordered::detail::foa::plain_integral> *)
                  in_stack_ffffffffffffe668,
                  CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
    local_2b4 = uVar3;
    if (uVar3 != 0) {
      local_2c0 = boost::unordered::detail::foa::
                  table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                  ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                              *)0x22b940);
      local_2c8 = local_2c0 + local_2a8 * 0xf;
      do {
        local_2cc = boost::unordered::detail::foa::unchecked_countr_zero(0);
        in_stack_ffffffffffffe668 =
             (basic_string_view<char,_std::char_traits<char>_> *)
             boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
             ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                     *)0x22b990);
        in_stack_ffffffffffffe670 = local_280;
        in_stack_ffffffffffffe678 =
             boost::unordered::detail::foa::
             table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
             ::
             key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>
                       ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>
                         *)0x22b9be);
        bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           CONCAT44(uVar3,in_stack_ffffffffffffe680),in_stack_ffffffffffffe678,
                           in_stack_ffffffffffffe670);
        if (bVar1) {
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>
          ::table_locator(&local_798,local_2b0,local_2cc,local_2c8 + local_2cc);
          goto LAB_0022bac5;
        }
        local_2b4 = local_2b4 - 1 & local_2b4;
      } while (local_2b4 != 0);
    }
    in_stack_ffffffffffffe667 =
         boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
         is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                           CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660),
                           (size_t)in_stack_ffffffffffffe658);
    if ((bool)in_stack_ffffffffffffe667) break;
    bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                      (&local_2a0,(size_t)(item->predefineSource)._M_dataplus._M_p);
    if (!bVar1) {
      memset(&local_798,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>
      ::table_locator(&local_798);
LAB_0022bac5:
      bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                        ((table_locator *)&local_798);
      if (bVar1) {
        local_7a8 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                    ::make_iterator((locator *)0x22bae7);
        local_7a9 = false;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_1108,&local_7a8,&local_7a9);
      }
      else if ((pPVar8->predefines).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start <
               *(pointer *)((long)&(pPVar8->predefineSource).field_2 + 8)) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
        ::
        unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                  (this_00,(size_t)item,CONCAT44(uVar3,in_stack_ffffffffffffe680),
                   (try_emplace_args_t *)in_stack_ffffffffffffe678,in_stack_ffffffffffffe670);
        local_7c0 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                    ::make_iterator((locator *)0x22bb71);
        local_7d9[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_1108,&local_7c0,local_7d9);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                  ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                    *)this_01,CONCAT44(uVar2,in_stack_ffffffffffffe6d8),
                   (try_emplace_args_t *)in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6c8);
        local_7f0 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
                    ::make_iterator((locator *)0x22bbe1);
        local_809[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                  (&local_1108,&local_7f0,local_809);
      }
      ppVar6 = boost::unordered::detail::foa::
               table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
               ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                             *)CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
      (ppVar6->second).kind = local_14d8.kind;
      *(undefined4 *)&(ppVar6->second).field_0x4 = local_14d8._4_4_;
      (ppVar6->second).endRegion._M_len = local_14d8.endRegion._M_len;
      (ppVar6->second).endRegion._M_str = local_14d8.endRegion._M_str;
      parsing::ParserOptions::ParserOptions(&local_1510);
      local_1510.languageVersion = *(LanguageVersion *)(in_RDI + 0x11a8);
      bVar1 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x22bc8b);
      if (bVar1) {
        puVar7 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x22bcac);
        local_1510.maxRecursionDepth = *puVar7;
      }
      Bag::set<slang::driver::SourceOptions&>((Bag *)this_00,(SourceOptions *)item);
      Bag::set<slang::parsing::PreprocessorOptions&>((Bag *)this_00,item);
      Bag::set<slang::parsing::LexerOptions&>((Bag *)this_00,(LexerOptions *)item);
      Bag::set<slang::parsing::ParserOptions&>((Bag *)this_00,(ParserOptions *)item);
      parsing::LexerOptions::~LexerOptions((LexerOptions *)0x22bd1e);
      parsing::PreprocessorOptions::~PreprocessorOptions
                ((PreprocessorOptions *)
                 CONCAT17(in_stack_ffffffffffffe667,in_stack_ffffffffffffe660));
      return;
    }
  }
  memset(&local_798,0,0x18);
  boost::unordered::detail::foa::
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>
  ::table_locator(&local_798);
  goto LAB_0022bac5;
}

Assistant:

void Driver::addParseOptions(Bag& bag) const {
    SourceOptions soptions;
    soptions.numThreads = options.numThreads;
    soptions.singleUnit = options.singleUnit == true;
    soptions.onlyLint = options.lintMode();
    soptions.librariesInheritMacros = options.librariesInheritMacros == true;

    PreprocessorOptions ppoptions;
    ppoptions.predefines = options.defines;
    ppoptions.undefines = options.undefines;
    ppoptions.predefineSource = "<command-line>";
    ppoptions.languageVersion = languageVersion;
    if (options.maxIncludeDepth.has_value())
        ppoptions.maxIncludeDepth = *options.maxIncludeDepth;
    for (const auto& d : options.ignoreDirectives)
        ppoptions.ignoreDirectives.emplace(d);

    LexerOptions loptions;
    loptions.languageVersion = languageVersion;
    loptions.enableLegacyProtect = options.enableLegacyProtect == true;
    if (options.maxLexerErrors.has_value())
        loptions.maxErrors = *options.maxLexerErrors;

    if (loptions.enableLegacyProtect)
        loptions.commentHandlers["pragma"]["protect"] = {CommentHandler::Protect};

    for (auto& [common, start, end] : translateOffFormats)
        loptions.commentHandlers[common][start] = {CommentHandler::TranslateOff, end};

    loptions.commentHandlers["slang"]["lint_off"] = {CommentHandler::LintOff};
    loptions.commentHandlers["slang"]["lint_on"] = {CommentHandler::LintOn};
    loptions.commentHandlers["slang"]["lint_save"] = {CommentHandler::LintSave};
    loptions.commentHandlers["slang"]["lint_restore"] = {CommentHandler::LintRestore};

    ParserOptions poptions;
    poptions.languageVersion = languageVersion;
    if (options.maxParseDepth.has_value())
        poptions.maxRecursionDepth = *options.maxParseDepth;

    bag.set(soptions);
    bag.set(ppoptions);
    bag.set(loptions);
    bag.set(poptions);
}